

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tent_dist.hpp
# Opt level: O2

result_type_conflict2 __thiscall
trng::tent_dist<double>::cdf(tent_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = x - (this->P).m_;
  dVar1 = (this->P).d_;
  dVar3 = 0.0;
  if (-dVar1 < dVar2) {
    if (dVar2 <= 0.0) {
      dVar3 = ((dVar2 + dVar1) * (dVar2 + dVar1)) / ((dVar1 + dVar1) * dVar1);
    }
    else if (dVar1 <= dVar2) {
      dVar3 = 1.0;
    }
    else {
      dVar3 = 1.0 - ((dVar2 - dVar1) * (dVar2 - dVar1)) / ((dVar1 + dVar1) * dVar1);
    }
  }
  return dVar3;
}

Assistant:

cdf(result_type x) const {
      x -= P.m();
      if (x <= -P.d())
        return 0;
      if (x <= 0)
        return (x + P.d()) * (x + P.d()) / (result_type(2) * P.d() * P.d());
      if (x < P.d())
        return 1 - (x - P.d()) * (x - P.d()) / (result_type(2) * P.d() * P.d());
      return 1;
    }